

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void Assimp::BlenderImporter::NotSupportedObjectType(Object *obj,char *type)

{
  format local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<((ostream *)&local_190,"Object `");
  std::operator<<((ostream *)&local_190,(obj->id).name);
  std::operator<<((ostream *)&local_190,"` - type is unsupported: `");
  std::operator<<((ostream *)&local_190,type);
  std::operator<<((ostream *)&local_190,"`, skipping");
  LogFunctions<Assimp::BlenderImporter>::LogWarn(&local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return;
}

Assistant:

void BlenderImporter::NotSupportedObjectType(const Object* obj, const char* type)
{
    LogWarn((format(), "Object `",obj->id.name,"` - type is unsupported: `",type, "`, skipping" ));
}